

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triple.cpp
# Opt level: O0

Triple * __thiscall
llvm::Triple::getLittleEndianArchVariant(Triple *__return_storage_ptr__,Triple *this)

{
  bool bVar1;
  ArchType AVar2;
  Triple *this_local;
  Triple *T;
  
  Triple(__return_storage_ptr__,this);
  bVar1 = isLittleEndian(this);
  if (!bVar1) {
    AVar2 = getArch(this);
    switch(AVar2) {
    case UnknownArch:
    case armeb:
    case ppc:
    case sparcv9:
    case systemz:
    case thumbeb:
    case lanai:
      setArch(__return_storage_ptr__,UnknownArch);
      break;
    default:
      llvm_unreachable_internal
                ("getLittleEndianArchVariant: unknown triple.",
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/Triple.cpp"
                 ,0x5bb);
    case aarch64_be:
      setArch(__return_storage_ptr__,aarch64);
      break;
    case bpfeb:
      setArch(__return_storage_ptr__,bpfel);
      break;
    case mips:
      setArch(__return_storage_ptr__,mipsel);
      break;
    case mips64:
      setArch(__return_storage_ptr__,mips64el);
      break;
    case ppc64:
      setArch(__return_storage_ptr__,ppc64le);
      break;
    case sparc:
      setArch(__return_storage_ptr__,sparcel);
      break;
    case tce:
      setArch(__return_storage_ptr__,tcele);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Triple Triple::getLittleEndianArchVariant() const {
  Triple T(*this);
  if (isLittleEndian())
    return T;

  switch (getArch()) {
  case Triple::UnknownArch:
  case Triple::lanai:
  case Triple::ppc:
  case Triple::sparcv9:
  case Triple::systemz:

  // ARM is intentionally unsupported here, changing the architecture would
  // drop any arch suffixes.
  case Triple::armeb:
  case Triple::thumbeb:
    T.setArch(UnknownArch);
    break;

  case Triple::tce:        T.setArch(Triple::tcele);    break;
  case Triple::aarch64_be: T.setArch(Triple::aarch64);  break;
  case Triple::bpfeb:      T.setArch(Triple::bpfel);    break;
  case Triple::mips64:     T.setArch(Triple::mips64el); break;
  case Triple::mips:       T.setArch(Triple::mipsel);   break;
  case Triple::ppc64:      T.setArch(Triple::ppc64le);  break;
  case Triple::sparc:      T.setArch(Triple::sparcel);  break;
  default:
    llvm_unreachable("getLittleEndianArchVariant: unknown triple.");
  }
  return T;
}